

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveVecToPtr
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Vec *src,BaseReg *out)

{
  bool bVar1;
  Error EVar2;
  long in_RCX;
  uint *in_RDX;
  long in_RSI;
  long *in_RDI;
  BaseEmitter *in_R8;
  Error _err_3;
  Mem stackPtr;
  Error _err_2;
  Error _err_1;
  VirtReg *vReg;
  Error _err;
  uint32_t vMovInstId;
  Mem vecPtr;
  Vec vecReg;
  uint32_t argStackOffset;
  uint32_t argSize;
  undefined4 in_stack_fffffffffffffa18;
  uint32_t in_stack_fffffffffffffa1c;
  uint in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  EmitterExplicitT<asmjit::v1_14::x86::Compiler> *this_00;
  BaseEmitter *this_01;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  BaseCompiler *in_stack_fffffffffffffa50;
  uint local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  Error local_590;
  Error local_58c;
  VirtReg *local_588;
  Error local_57c;
  undefined4 local_578;
  uint local_574;
  undefined4 local_570;
  undefined4 local_56c;
  uint local_568;
  uint32_t local_564;
  uint32_t local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  uint local_550;
  uint32_t local_54c;
  BaseEmitter *local_548;
  long local_540;
  uint *local_538;
  long local_530 [2];
  Error local_51c;
  BaseEmitter *local_518;
  long local_510;
  long local_4d0;
  long local_4c8;
  byte *local_4c0;
  uint *local_4b0;
  undefined4 local_4a8;
  undefined4 local_4a4;
  long local_498;
  long *local_490;
  byte local_485;
  uint32_t local_484;
  int local_480;
  undefined4 local_47c;
  uint32_t *local_478;
  uint32_t *local_470;
  undefined4 local_464;
  uint32_t *local_460;
  uint32_t *local_458;
  undefined4 local_44c;
  undefined4 local_448;
  int local_444;
  uint *local_440;
  undefined1 *local_438;
  undefined4 local_42c;
  undefined4 local_428;
  undefined4 local_424;
  BaseEmitter *local_420;
  uint *local_418;
  undefined4 local_40c;
  undefined4 local_408;
  uint local_404;
  uint *local_400;
  uint *local_3f8;
  BaseEmitter *local_3f0;
  uint *local_3e8;
  BaseEmitter *local_3e0;
  BaseEmitter *local_3d8;
  uint *local_3d0;
  byte local_3c1;
  long local_3c0;
  byte local_3b1;
  undefined1 *local_3b0;
  undefined4 local_3a4;
  VirtReg *local_3a0;
  uint32_t *local_398;
  uint *local_390;
  undefined4 local_384;
  long local_380;
  uint *local_378;
  uint *local_370;
  undefined4 local_364;
  uint32_t *local_360;
  uint32_t *local_358;
  byte *local_350;
  undefined4 local_344;
  uint *local_340;
  undefined4 local_334;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  uint32_t *local_318;
  uint32_t *local_310;
  undefined4 local_308;
  uint local_304 [3];
  uint local_2f8;
  uint local_2f4 [3];
  uint *local_2e8;
  uint *local_2e0;
  undefined4 local_2d4;
  uint *local_2d0;
  uint *local_2c8;
  uint *local_2c0;
  byte local_2b5;
  uint local_2b4;
  uint *local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 *local_2a0;
  uint *local_298;
  uint local_28c;
  undefined4 *local_288;
  uint *local_280;
  uint local_274;
  uint *local_270;
  uint *local_268;
  uint local_25c;
  undefined4 local_258;
  uint local_254;
  undefined4 local_250;
  uint local_24c;
  uint local_248;
  uint local_244 [3];
  BaseEmitter *local_238;
  uint *local_230;
  undefined4 local_224;
  BaseEmitter *local_220;
  BaseEmitter *local_218;
  BaseEmitter *local_210;
  byte local_205;
  uint local_204;
  BaseEmitter *local_200;
  undefined4 local_1f8;
  undefined4 local_1f4;
  char *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int line;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 local_1a8;
  uint local_1a4 [3];
  uint local_198;
  uint local_194 [3];
  uint *local_188;
  undefined1 *local_180;
  undefined4 local_174;
  uint *local_170;
  uint *local_168;
  uint *local_160;
  byte local_155;
  uint local_154;
  uint *local_150;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 *local_140;
  uint *local_138;
  uint local_12c;
  undefined4 *local_128;
  uint *local_120;
  uint local_114;
  uint *local_110;
  uint *local_108;
  uint local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  long local_e0;
  byte *local_d8;
  int local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  uint *local_c0;
  undefined1 *local_b8;
  int local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  uint *local_a0;
  undefined1 *local_98;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  uint *local_80;
  uint *local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  uint *local_60;
  uint *local_58;
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  uint *local_40;
  uint *local_38;
  uint local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint *local_20;
  uint *local_18;
  uint *local_10;
  uint32_t *local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_490 = local_530;
  local_334 = 0x100;
  local_548 = in_R8;
  local_540 = in_RCX;
  local_538 = in_RDX;
  local_530[0] = in_RSI;
  bVar1 = Support::test<unsigned_int,unsigned_int>(*in_RDX,0x100);
  if (!bVar1) {
    DebugUtils::assertionFailed
              ((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),line,
               in_stack_fffffffffffffe10);
  }
  local_4b0 = local_538;
  local_485 = (byte)*local_538;
  local_54c = (uint32_t)(byte)TypeUtils::_typeData[(ulong)local_485 + 0x100];
  if (local_54c == 0) {
    local_51c = DebugUtils::errored(3);
  }
  else {
    if (local_54c < 0x10) {
      local_54c = 0x10;
    }
    local_4c8 = local_530[0];
    local_480 = *(int *)(local_530[0] + 0x108);
    local_484 = local_54c;
    local_550 = local_480 + (local_54c - 1) & (local_54c - 1 ^ 0xffffffff);
    local_498 = in_RDI[4];
    FuncFrame::updateCallStackAlignment((FuncFrame *)(local_498 + 0x2d0),local_54c);
    local_4d0 = local_530[0];
    *(uint *)(local_530[0] + 0x108) = local_550 + local_54c;
    local_564 = (uint32_t)x86VecRegSignatureBySize(local_54c);
    local_510 = local_540;
    local_47c = *(undefined4 *)(local_540 + 4);
    local_470 = &local_560;
    local_478 = &local_564;
    local_320 = 0;
    local_324 = 0;
    local_558 = 0;
    local_554 = 0;
    local_400 = (uint *)(*in_RDI + 0x1d8);
    local_3f8 = &local_574;
    local_404 = local_550;
    local_408 = 0;
    local_40c = 0;
    local_2d4 = 0;
    local_2e0 = &local_574;
    local_2f4[2] = local_550;
    local_2f4[1] = 0;
    local_2a8 = 2;
    local_2a4 = 2;
    local_304[1] = 2;
    local_2b5 = (byte)(*local_400 >> 3) & 0x1f;
    local_304[0] = (uint)local_2b5 << 3;
    local_268 = local_304 + 1;
    local_270 = local_304;
    local_304[2] = local_304[0] | 2;
    local_e8 = 0;
    local_308 = 0;
    local_280 = local_304 + 2;
    local_288 = &local_308;
    local_298 = &local_2f8;
    local_2a0 = &local_2d4;
    local_44 = *(undefined4 *)(*in_RDI + 0x1dc);
    local_40 = local_2f4;
    local_48 = 0;
    local_4c = local_550;
    local_28 = 0;
    local_2c = local_550;
    local_56c = 0;
    local_568 = local_550;
    local_4a4 = 0x1ba;
    local_4a8 = 0x4a9;
    if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
      uVar3 = 0x1ba;
    }
    else {
      uVar3 = 0x4a9;
    }
    local_578 = uVar3;
    if (0x10 < local_54c) {
      local_578 = 0x4a9;
    }
    this_00 = (EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)in_RDI[1];
    local_3c0 = in_RDI[1];
    local_d8 = (byte *)(local_3c0 + 0x48);
    local_3c1 = *local_d8;
    local_3b0 = _archTraits + (ulong)local_3c1 * 0xd8;
    local_4c0 = (byte *)(in_RDI[1] + 0x50);
    local_3b1 = *local_4c0 >> 3;
    this_01 = local_548;
    local_464 = local_47c;
    local_460 = local_478;
    local_458 = local_470;
    local_3d0 = local_400;
    local_364 = local_47c;
    local_360 = local_478;
    local_358 = local_470;
    local_350 = local_4c0;
    local_31c = local_47c;
    local_318 = local_478;
    local_310 = local_470;
    local_2f8 = local_304[2];
    local_2f4[0] = local_304[2];
    local_2e8 = local_400;
    local_2d0 = local_400;
    local_2c8 = local_400;
    local_2c0 = local_400;
    local_2b4 = local_304[0];
    local_2b0 = local_400;
    local_28c = local_304[2];
    local_274 = local_304[2];
    local_25c = local_304[2];
    local_e4 = local_308;
    local_e0 = local_3c0;
    local_38 = local_2e0;
    local_24 = local_44;
    local_20 = local_40;
    local_18 = local_2e0;
    local_574 = local_304[2];
    local_570 = local_44;
    local_560 = local_564;
    local_55c = local_47c;
    Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
              ((Array<asmjit::v1_14::TypeId,_32UL> *)
               CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (RegType *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
    local_57c = BaseCompiler::_newReg
                          (in_stack_fffffffffffffa50,
                           (BaseReg *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                           (TypeId)((ulong)in_RDI >> 0x38),
                           (char *)CONCAT44(uVar3,in_stack_fffffffffffffa38));
    local_51c = local_57c;
    if (local_57c == 0) {
      local_518 = local_548;
      local_588 = BaseCompiler::virtRegById
                            ((BaseCompiler *)
                             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                             in_stack_fffffffffffffa1c);
      local_3a4 = 0x50;
      local_588[0xe] = (VirtReg)0x50;
      local_3d8 = local_548;
      local_3a0 = local_588;
      EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::lea
                        (this_00,(Gp *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20)
                         ,(Mem *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      local_51c = EVar2;
      if (EVar2 == 0) {
        local_380 = in_RDI[1];
        local_3e0 = local_548;
        local_418 = &local_5a0;
        local_420 = local_548;
        local_424 = 0;
        local_428 = 0;
        local_42c = 0;
        local_224 = 0;
        local_238 = local_548;
        local_244[2] = 0;
        local_244[1] = 0;
        local_1f8 = 2;
        local_1f4 = 2;
        local_250 = 2;
        local_218 = local_548;
        local_210 = local_548;
        local_200 = local_548;
        local_205 = *(byte *)&local_548->_vptr_BaseEmitter >> 3;
        local_254 = (uint)local_205 << 3;
        local_24c = local_254 | 2;
        local_f0 = 0;
        local_258 = 0;
        local_220 = local_548;
        local_84 = *(undefined4 *)((long)&local_548->_vptr_BaseEmitter + 4);
        local_80 = local_244;
        local_88 = 0;
        local_8c = 0;
        local_68 = 0;
        local_6c = 0;
        local_598 = 0;
        local_594 = 0;
        local_384 = local_578;
        local_398 = &local_560;
        local_58c = EVar2;
        local_390 = local_418;
        local_248 = local_24c;
        local_244[0] = local_24c;
        local_230 = local_418;
        local_204 = local_254;
        local_ec = local_258;
        local_78 = local_418;
        local_64 = local_84;
        local_60 = local_80;
        local_58 = local_418;
        local_10 = local_418;
        local_8 = local_398;
        local_5a0 = local_24c;
        local_59c = local_84;
        local_51c = BaseEmitter::_emitI(this_01,(InstId)((ulong)this_00 >> 0x20),
                                        (Operand_ *)(ulong)in_stack_fffffffffffffa20,
                                        (Operand_ *)
                                        CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18
                                                ));
        if (local_51c == 0) {
          local_378 = local_538;
          local_340 = local_538;
          local_344 = 0x200;
          local_590 = local_51c;
          bVar1 = Support::test<unsigned_int,unsigned_int>(*local_538,0x200);
          if (bVar1) {
            local_440 = (uint *)(*in_RDI + 0x1d8);
            local_370 = local_538;
            local_444 = (int)*local_538 >> 0xc;
            local_438 = &stack0xfffffffffffffa50;
            local_448 = 0;
            local_44c = 0;
            local_174 = 0;
            local_180 = &stack0xfffffffffffffa50;
            local_194[1] = 0;
            local_148 = 2;
            local_144 = 2;
            local_1a4[1] = 2;
            local_155 = (byte)(*local_440 >> 3) & 0x1f;
            local_1a4[0] = (uint)local_155 << 3;
            local_108 = local_1a4 + 1;
            local_110 = local_1a4;
            local_1a4[2] = local_1a4[0] | 2;
            local_f8 = 0;
            local_1a8 = 0;
            local_120 = local_1a4 + 2;
            local_128 = &local_1a8;
            local_138 = &local_198;
            local_140 = &local_174;
            local_c4 = *(undefined4 *)(*in_RDI + 0x1dc);
            local_c0 = local_194;
            local_c8 = 0;
            local_a8 = 0;
            local_3f0 = local_548;
            local_3e8 = local_440;
            local_198 = local_1a4[2];
            local_194[0] = local_1a4[2];
            local_194[2] = local_444;
            local_188 = local_440;
            local_170 = local_440;
            local_168 = local_440;
            local_160 = local_440;
            local_154 = local_1a4[0];
            local_150 = local_440;
            local_12c = local_1a4[2];
            local_114 = local_1a4[2];
            local_fc = local_1a4[2];
            local_f4 = local_1a8;
            local_cc = local_444;
            local_b8 = local_180;
            local_ac = local_444;
            local_a4 = local_c4;
            local_a0 = local_c0;
            local_98 = local_180;
            EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::mov
                              (this_00,(Mem *)CONCAT44(EVar2,local_51c),
                               (Gp *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
            if (EVar2 != 0) {
              return EVar2;
            }
          }
          local_51c = 0;
        }
      }
    }
  }
  return local_51c;
}

Assistant:

Error RACFGBuilder::moveVecToPtr(InvokeNode* invokeNode, const FuncValue& arg, const Vec& src, BaseReg* out) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isReg());

  uint32_t argSize = TypeUtils::sizeOf(arg.typeId());
  if (argSize == 0)
    return DebugUtils::errored(kErrorInvalidState);

  if (argSize < 16)
    argSize = 16;

  uint32_t argStackOffset = Support::alignUp(invokeNode->detail()._argStackSize, argSize);
  _funcNode->frame().updateCallStackAlignment(argSize);
  invokeNode->detail()._argStackSize = argStackOffset + argSize;

  Vec vecReg(x86VecRegSignatureBySize(argSize), src.id());
  Mem vecPtr = ptr(_pass->_sp.as<Gp>(), int32_t(argStackOffset));

  uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);
  if (argSize > 16)
    vMovInstId = Inst::kIdVmovaps;

  ASMJIT_PROPAGATE(cc()->_newReg(out, ArchTraits::byArch(cc()->arch()).regTypeToTypeId(cc()->_gpSignature.regType()), nullptr));

  VirtReg* vReg = cc()->virtRegById(out->id());
  vReg->setWeight(BaseRAPass::kCallArgWeight);

  ASMJIT_PROPAGATE(cc()->lea(out->as<Gp>(), vecPtr));
  ASMJIT_PROPAGATE(cc()->emit(vMovInstId, ptr(out->as<Gp>()), vecReg));

  if (arg.isStack()) {
    Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
    ASMJIT_PROPAGATE(cc()->mov(stackPtr, out->as<Gp>()));
  }

  return kErrorOk;
}